

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O3

void __thiscall httpproxy::httpproxy(httpproxy *this,naiveconfig *cfg)

{
  tcpproxy::tcpproxy(&this->super_tcpproxy,cfg);
  (this->super_tcpproxy).super_proxy._vptr_proxy = (_func_int **)&PTR__httpproxy_00109ca8;
  (this->clientfds)._M_h._M_buckets = &(this->clientfds)._M_h._M_single_bucket;
  (this->clientfds)._M_h._M_bucket_count = 1;
  (this->clientfds)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->clientfds)._M_h._M_element_count = 0;
  (this->clientfds)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->clientfds)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->clientfds)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

httpproxy(naiveconfig *cfg) : tcpproxy(cfg){}